

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  uint uVar1;
  ulong uVar2;
  int in_ECX;
  int in_EDX;
  uchar *in_RSI;
  undefined4 *in_RDI;
  LodePNGColorMode *in_R8;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint n;
  uchar *p;
  uint matchkey_1;
  uint bits;
  uchar a_2;
  uchar b_2;
  uchar g_2;
  uchar r_2;
  uint matchkey;
  unsigned_short a_1;
  unsigned_short b_1;
  unsigned_short g_1;
  unsigned_short r_1;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uint sixteen;
  uint maxnumcolors;
  uint bits_done;
  uint bpp;
  uint numcolors_done;
  uint alpha_done;
  uint colored_done;
  size_t numpixels;
  ColorTree tree;
  size_t i;
  uint error;
  LodePNGColorMode *pLVar6;
  ColorTree *in_stack_fffffffffffffee0;
  bool local_116;
  uint local_114;
  uint local_110;
  undefined4 *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  uint in_stack_ffffffffffffff08;
  char cVar7;
  byte bVar8;
  byte bVar9;
  byte value;
  undefined4 in_stack_ffffffffffffff10;
  unsigned_short in_stack_ffffffffffffff14;
  unsigned_short uVar10;
  unsigned_short in_stack_ffffffffffffff16;
  unsigned_short uVar11;
  unsigned_short in_stack_ffffffffffffff18;
  unsigned_short uVar12;
  unsigned_short in_stack_ffffffffffffff1a;
  unsigned_short uVar13;
  ushort in_stack_ffffffffffffff1c;
  ushort in_stack_ffffffffffffff1e;
  ushort in_stack_ffffffffffffff20;
  ushort in_stack_ffffffffffffff22;
  int iVar14;
  undefined4 uVar15;
  uint local_d8;
  uint uVar16;
  ColorTree local_b8;
  size_t local_30;
  uint local_24;
  LodePNGColorMode *local_20;
  uchar *local_10;
  undefined4 *local_8;
  
  local_24 = 0;
  uVar2 = (ulong)(uint)(in_EDX * in_ECX);
  local_20 = in_R8;
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar1 = lodepng_is_greyscale_type(in_R8);
  bVar3 = uVar1 != 0;
  uVar1 = lodepng_can_have_alpha((LodePNGColorMode *)in_stack_fffffffffffffee0);
  bVar4 = uVar1 == 0;
  uVar16 = 0;
  uVar1 = lodepng_get_bpp((LodePNGColorMode *)0x292da3);
  bVar5 = uVar1 == 1;
  local_d8 = 0x101;
  iVar14 = 0;
  if (uVar1 < 9) {
    if (uVar1 == 1) {
      local_110 = 2;
    }
    else {
      if (uVar1 == 2) {
        local_114 = 4;
      }
      else {
        local_114 = 0x100;
        if (uVar1 == 4) {
          local_114 = 0x10;
        }
      }
      local_110 = local_114;
    }
    local_d8 = local_110;
  }
  color_tree_init(&local_b8);
  if (local_20->bitdepth == 0x10) {
    for (local_30 = 0; local_30 != uVar2; local_30 = local_30 + 1) {
      getPixelColorRGBA16((unsigned_short *)&stack0xffffffffffffff22,
                          (unsigned_short *)&stack0xffffffffffffff20,
                          (unsigned_short *)&stack0xffffffffffffff1e,
                          (unsigned_short *)&stack0xffffffffffffff1c,local_10,local_30,local_20);
      if (((((in_stack_ffffffffffffff22 & 0xff) != (int)(uint)in_stack_ffffffffffffff22 >> 8) ||
           ((in_stack_ffffffffffffff20 & 0xff) != (int)(uint)in_stack_ffffffffffffff20 >> 8)) ||
          ((in_stack_ffffffffffffff1e & 0xff) != (int)(uint)in_stack_ffffffffffffff1e >> 8)) ||
         ((in_stack_ffffffffffffff1c & 0xff) != (int)(uint)in_stack_ffffffffffffff1c >> 8)) {
        iVar14 = 1;
        break;
      }
    }
  }
  if (iVar14 == 0) {
    uVar15 = 0;
    for (local_30 = 0; local_30 != uVar2; local_30 = local_30 + 1) {
      value = 0;
      bVar9 = 0;
      bVar8 = 0;
      cVar7 = '\0';
      pLVar6 = local_20;
      getPixelColorRGBA8((uchar *)CONCAT44(uVar15,CONCAT22(in_stack_ffffffffffffff22,
                                                           in_stack_ffffffffffffff20)),
                         (uchar *)CONCAT26(in_stack_ffffffffffffff1e,
                                           CONCAT24(in_stack_ffffffffffffff1c,
                                                    CONCAT22(in_stack_ffffffffffffff1a,
                                                             in_stack_ffffffffffffff18))),
                         (uchar *)CONCAT26(in_stack_ffffffffffffff16,
                                           CONCAT24(in_stack_ffffffffffffff14,
                                                    in_stack_ffffffffffffff10)),
                         (uchar *)(ulong)in_stack_ffffffffffffff08,
                         (uchar *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (size_t)in_stack_fffffffffffffef8,
                         (LodePNGColorMode *)CONCAT44(uVar16,uVar1));
      if (((!bVar5) && ((uint)local_8[0x106] < 8)) &&
         (in_stack_ffffffffffffff08 = getValueRequiredBits(value),
         (uint)local_8[0x106] < in_stack_ffffffffffffff08)) {
        local_8[0x106] = in_stack_ffffffffffffff08;
      }
      bVar5 = uVar1 <= (uint)local_8[0x106];
      if ((!bVar3) && ((value != bVar9 || (value != bVar8)))) {
        *local_8 = 1;
        bVar3 = true;
        if ((uint)local_8[0x106] < 8) {
          local_8[0x106] = 8;
        }
      }
      if (!bVar4) {
        local_116 = false;
        if (((ushort)value == *(ushort *)(local_8 + 2)) &&
           (local_116 = false, (ushort)bVar9 == *(ushort *)((long)local_8 + 10))) {
          local_116 = (ushort)bVar8 == *(ushort *)(local_8 + 3);
        }
        in_stack_ffffffffffffff04 = (uint)local_116;
        if ((cVar7 == -1) ||
           ((cVar7 == '\0' && ((local_8[1] == 0 || (in_stack_ffffffffffffff04 != 0)))))) {
          if ((cVar7 == '\0') && ((local_8[4] == 0 && (local_8[1] == 0)))) {
            local_8[1] = 1;
            *(ushort *)(local_8 + 2) = (ushort)value;
            *(ushort *)((long)local_8 + 10) = (ushort)bVar9;
            *(ushort *)(local_8 + 3) = (ushort)bVar8;
          }
          else if ((cVar7 == -1) && ((local_8[1] != 0 && (in_stack_ffffffffffffff04 != 0)))) {
            local_8[4] = 1;
            bVar4 = true;
            if ((uint)local_8[0x106] < 8) {
              local_8[0x106] = 8;
            }
          }
        }
        else {
          local_8[4] = 1;
          bVar4 = true;
          if ((uint)local_8[0x106] < 8) {
            local_8[0x106] = 8;
          }
        }
      }
      if ((uVar16 == 0) &&
         (iVar14 = color_tree_has(in_stack_fffffffffffffee0,(uchar)((ulong)pLVar6 >> 0x38),
                                  (uchar)((ulong)pLVar6 >> 0x30),(uchar)((ulong)pLVar6 >> 0x28),
                                  (uchar)((ulong)pLVar6 >> 0x20)), iVar14 == 0)) {
        color_tree_add(in_stack_fffffffffffffee0,(uchar)((ulong)pLVar6 >> 0x38),
                       (uchar)((ulong)pLVar6 >> 0x30),(uchar)((ulong)pLVar6 >> 0x28),
                       (uchar)((ulong)pLVar6 >> 0x20),(uint)pLVar6);
        if ((uint)local_8[5] < 0x100) {
          in_stack_fffffffffffffef8 = local_8 + 6;
          iVar14 = local_8[5];
          *(byte *)((long)in_stack_fffffffffffffef8 + (ulong)(uint)(iVar14 << 2)) = value;
          *(byte *)((long)in_stack_fffffffffffffef8 + (ulong)(iVar14 * 4 + 1)) = bVar9;
          *(byte *)((long)in_stack_fffffffffffffef8 + (ulong)(iVar14 * 4 + 2)) = bVar8;
          *(char *)((long)in_stack_fffffffffffffef8 + (ulong)(iVar14 * 4 + 3)) = cVar7;
        }
        local_8[5] = local_8[5] + 1;
        uVar16 = (uint)(local_d8 <= (uint)local_8[5]);
      }
      if ((((bVar4) && (uVar16 != 0)) && (bVar3)) && (bVar5)) break;
    }
    *(short *)(local_8 + 2) = *(short *)(local_8 + 2) + *(short *)(local_8 + 2) * 0x100;
    *(short *)((long)local_8 + 10) =
         *(short *)((long)local_8 + 10) + *(short *)((long)local_8 + 10) * 0x100;
    *(short *)(local_8 + 3) = *(short *)(local_8 + 3) + *(short *)(local_8 + 3) * 0x100;
  }
  else {
    uVar13 = 0;
    uVar12 = 0;
    uVar11 = 0;
    uVar10 = 0;
    local_8[0x106] = 0x10;
    iVar14 = 1;
    for (local_30 = 0; local_30 != uVar2; local_30 = local_30 + 1) {
      getPixelColorRGBA16((unsigned_short *)&stack0xffffffffffffff1a,
                          (unsigned_short *)&stack0xffffffffffffff18,
                          (unsigned_short *)&stack0xffffffffffffff16,
                          (unsigned_short *)&stack0xffffffffffffff14,local_10,local_30,local_20);
      if ((!bVar3) && ((uVar13 != uVar12 || (uVar13 != uVar11)))) {
        *local_8 = 1;
        bVar3 = true;
      }
      if (!bVar4) {
        bVar5 = false;
        if ((uVar13 == *(unsigned_short *)(local_8 + 2)) &&
           (bVar5 = false, uVar12 == *(unsigned_short *)((long)local_8 + 10))) {
          bVar5 = uVar11 == *(unsigned_short *)(local_8 + 3);
        }
        if ((uVar10 == 0xffff) || ((uVar10 == 0 && ((local_8[1] == 0 || (bVar5)))))) {
          if ((uVar10 == 0) && ((local_8[4] == 0 && (local_8[1] == 0)))) {
            local_8[1] = 1;
            *(unsigned_short *)(local_8 + 2) = uVar13;
            *(unsigned_short *)((long)local_8 + 10) = uVar12;
            *(unsigned_short *)(local_8 + 3) = uVar11;
          }
          else if ((uVar10 == 0xffff) && ((local_8[1] != 0 && (bVar5)))) {
            local_8[4] = 1;
            bVar4 = true;
          }
        }
        else {
          local_8[4] = 1;
          bVar4 = true;
          if ((uint)local_8[0x106] < 8) {
            local_8[0x106] = 8;
          }
        }
      }
      if (((bVar4) && (iVar14 != 0)) && (bVar3)) break;
    }
  }
  color_tree_cleanup(in_stack_fffffffffffffee0);
  return local_24;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }
  }
  else /* < 16-bit */
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned char r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}